

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  Impl *this_00;
  InMemoryDirectory *pIVar1;
  size_t sVar2;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> this_01;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  StringPtr name;
  Own<const_kj::Directory> result;
  Own<const_kj::Directory> local_58;
  Disposer *local_40;
  Directory *local_38;
  
  if ((this->super_Replacer<kj::Directory>).field_0xc == '\x01') {
    (anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit();
    bVar5 = true;
  }
  else {
    pIVar1 = (this->directory).ptr;
    _::Mutex::lock(&(pIVar1->impl).mutex,EXCLUSIVE);
    this_00 = &(pIVar1->impl).value;
    sVar2 = (this->name).content.size_;
    if (sVar2 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->name).content.ptr;
    }
    name.content.size_ = sVar2 + (sVar2 == 0);
    name.content.ptr = pcVar4;
    this_01 = Impl::openEntry(this_00,name,(this->super_Replacer<kj::Directory>).mode);
    bVar5 = this_01.ptr != (EntryImpl *)0x0;
    if (bVar5) {
      (*(((this->inner).ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[5])(&local_40);
      local_58.disposer = (Disposer *)0x0;
      local_58.ptr = (Directory *)0x0;
      if (local_38 != (Directory *)0x0) {
        local_58.ptr = local_38;
        local_58.disposer = local_40;
      }
      EntryImpl::set(this_01.ptr,&local_58);
      if (local_58.ptr != (Directory *)0x0) {
        local_58.ptr = (Directory *)0x0;
        (**(local_58.disposer)->_vptr_Disposer)();
      }
      lVar3 = (*(code *)**(undefined8 **)this_00->clock)();
      (pIVar1->impl).value.lastModified.value.value = lVar3;
    }
    _::Mutex::unlock(&(pIVar1->impl).mutex,EXCLUSIVE);
  }
  return bVar5;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry->set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }